

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O1

int32_t uloc_minimizeSubtags_63
                  (char *localeID,char *minimizedLocaleID,int32_t minimizedLocaleIDCapacity,
                  UErrorCode *err)

{
  char cVar1;
  UErrorCode UVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  int32_t iVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  char *__s;
  uint trailingLength;
  int32_t langLength;
  int32_t regionLength;
  int32_t scriptLength;
  char region [4];
  char script [6];
  char lang [12];
  char tagBuffer [157];
  char maximizedTagBuffer [157];
  char localeBuffer [157];
  
  uloc_canonicalize_63(localeID,localeBuffer,0x9d,err);
  UVar2 = *err;
  if ((UVar2 == U_BUFFER_OVERFLOW_ERROR) || (UVar2 == U_STRING_NOT_TERMINATED_WARNING)) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  iVar7 = -1;
  if (U_ZERO_ERROR < UVar2) {
    return -1;
  }
  langLength = 0xc;
  scriptLength = 6;
  regionLength = 4;
  if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
     (0 < minimizedLocaleIDCapacity && minimizedLocaleID != (char *)0x0)) {
    iVar3 = parseTagString(localeBuffer,lang,&langLength,script,&scriptLength,region,&regionLength,
                           err);
    if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
      for (__s = localeBuffer + iVar3; (*__s == '_' || (*__s == '-')); __s = __s + 1) {
      }
      sVar8 = strlen(__s);
      trailingLength = (uint)sVar8;
      if (0 < (int)trailingLength) {
        uVar9 = (ulong)(trailingLength & 0x7fffffff);
        iVar6 = 0;
        pcVar10 = __s;
        do {
          cVar1 = *pcVar10;
          iVar5 = 0;
          if ((cVar1 != '-') && (cVar1 != '_')) {
            if (cVar1 == '@') break;
            if (8 < iVar6) goto LAB_0028fb92;
            iVar5 = iVar6 + 1;
          }
          iVar6 = iVar5;
          pcVar10 = pcVar10 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      createTagStringWithAlternates
                (lang,langLength,script,scriptLength,region,regionLength,(char *)0x0,0,(char *)0x0,
                 maximizedTagBuffer,0x9d,err);
      if ((*err < U_ILLEGAL_ARGUMENT_ERROR) &&
         (uloc_addLikelySubtags_63(maximizedTagBuffer,maximizedTagBuffer,0x9d,err),
         *err < U_ILLEGAL_ARGUMENT_ERROR)) {
        uVar4 = createLikelySubtagsString
                          (lang,langLength,(char *)0x0,0,(char *)0x0,0,(char *)0x0,0,tagBuffer,0x9d,
                           err);
        if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar4);
          iVar5 = 0;
          if (iVar6 == 0) {
            iVar7 = createTagStringWithAlternates
                              (lang,langLength,(char *)0x0,0,(char *)0x0,0,__s,trailingLength,
                               (char *)0x0,minimizedLocaleID,minimizedLocaleIDCapacity,err);
            iVar5 = 1;
          }
        }
        else {
          iVar5 = 2;
        }
        if (iVar5 != 2) {
          if (iVar5 != 0) {
            return iVar7;
          }
          if (0 < regionLength) {
            uVar4 = createLikelySubtagsString
                              (lang,langLength,(char *)0x0,0,region,regionLength,(char *)0x0,0,
                               tagBuffer,0x9d,err);
            if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
              iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar4);
              iVar5 = 0;
              if (iVar6 == 0) {
                iVar7 = createTagStringWithAlternates
                                  (lang,langLength,(char *)0x0,0,region,regionLength,__s,
                                   trailingLength,(char *)0x0,minimizedLocaleID,
                                   minimizedLocaleIDCapacity,err);
                iVar5 = 1;
              }
            }
            else {
              iVar5 = 2;
            }
            if (iVar5 == 2) goto LAB_0028fb92;
            if (iVar5 != 0) {
              return iVar7;
            }
          }
          if ((0 < scriptLength) && (0 < regionLength)) {
            uVar4 = createLikelySubtagsString
                              (lang,langLength,script,scriptLength,(char *)0x0,0,(char *)0x0,0,
                               tagBuffer,0x9d,err);
            if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
              iVar6 = uprv_strnicmp_63(maximizedTagBuffer,tagBuffer,uVar4);
              iVar5 = 0;
              if (iVar6 == 0) {
                iVar7 = createTagStringWithAlternates
                                  (lang,langLength,script,scriptLength,(char *)0x0,0,__s,
                                   trailingLength,(char *)0x0,minimizedLocaleID,
                                   minimizedLocaleIDCapacity,err);
                iVar5 = 1;
              }
            }
            else {
              iVar5 = 2;
            }
            if (iVar5 == 2) goto LAB_0028fb92;
            if (iVar5 != 0) {
              return iVar7;
            }
          }
          sVar8 = strlen(localeBuffer);
          iVar3 = (int32_t)sVar8;
          iVar7 = minimizedLocaleIDCapacity;
          if (iVar3 < minimizedLocaleIDCapacity) {
            iVar7 = iVar3;
          }
          memcpy(minimizedLocaleID,localeBuffer,(long)iVar7);
          iVar7 = u_terminateChars_63(minimizedLocaleID,minimizedLocaleIDCapacity,iVar3,err);
          return iVar7;
        }
      }
    }
    else if (*err == U_BUFFER_OVERFLOW_ERROR) {
      *err = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
LAB_0028fb92:
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return -1;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_minimizeSubtags(const char*    localeID,
         char* minimizedLocaleID,
         int32_t minimizedLocaleIDCapacity,
         UErrorCode* err)
{
    char localeBuffer[ULOC_FULLNAME_CAPACITY];

    if (!do_canonicalize(
        localeID,
        localeBuffer,
        sizeof(localeBuffer),
        err)) {
        return -1;
    }
    else {
        return _uloc_minimizeSubtags(
                    localeBuffer,
                    minimizedLocaleID,
                    minimizedLocaleIDCapacity,
                    err);
    }    
}